

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O3

void __thiscall
wasm::
CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
::doEndResume(CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
              *this,Optimizer *self,Expression **currp)

{
  long lVar1;
  mapped_type *this_00;
  _Base_ptr p_Var2;
  NameSet *extraout_RDX;
  undefined1 local_78 [8];
  NameSet handlerBlocks;
  Name target;
  
  lVar1 = *(long *)&(this->branches)._M_t._M_impl.super__Rb_tree_header._M_header;
  if ((lVar1 == 0) || ((*(byte *)(lVar1 + 0x178) & 0x40) != 0)) {
    doEndThrowingInst((Optimizer *)this,(Expression **)self);
    currp = (Expression **)extraout_RDX;
  }
  handlerBlocks._M_t._M_impl._0_4_ = 0;
  handlerBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  handlerBlocks._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  handlerBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  handlerBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Rb_tree_node_base *)&handlerBlocks;
  handlerBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Rb_tree_node_base *)&handlerBlocks;
  BranchUtils::
  operateOnScopeNameUses<wasm::BranchUtils::getUniqueTargets(wasm::Expression*)::_lambda(wasm::Name&)_1_>
            ((BranchUtils *)
             (self->
             super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
             ).super_Pass._vptr_Pass,(Expression *)local_78,(anon_class_8_1_ba1d7401)currp);
  if (handlerBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
      (_Rb_tree_node_base *)&handlerBlocks) {
    p_Var2 = handlerBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      handlerBlocks._M_t._M_impl.super__Rb_tree_header._M_node_count = *(size_t *)(p_Var2 + 1);
      this_00 = std::
                map<wasm::Name,_std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*>_>_>_>_>
                ::operator[]((map<wasm::Name,_std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*>_>_>_>_>
                              *)&(this->loopLastBlockStack).
                                 super__Vector_base<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (key_type *)
                             &handlerBlocks._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      vector<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*>_>
      ::push_back(this_00,(value_type *)
                          &(this->loopLastBlockStack).
                           super__Vector_base<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while (p_Var2 != (_Rb_tree_node_base *)&handlerBlocks);
  }
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)local_78);
  return;
}

Assistant:

static void doEndResume(SubType* self, Expression** currp) {
    auto* module = self->getModule();
    if (!module || module->features.hasExceptionHandling()) {
      // This resume might throw, so run the code to handle that.
      doEndThrowingInst(self, currp);
    }
    auto handlerBlocks = BranchUtils::getUniqueTargets(*currp);
    // Add branches to the targets.
    for (auto target : handlerBlocks) {
      self->branches[target].push_back(self->currBasicBlock);
    }
  }